

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs_wrapper.hpp
# Opt level: O3

void __thiscall
AVSInterface::AVSInDelegator::Read
          (AVSInDelegator *this,char *name,vector<bool,_std::allocator<bool>_> *output)

{
  uint uVar1;
  char cVar2;
  undefined1 __x;
  int iVar3;
  AVSValue *pAVar4;
  code *pcVar5;
  long lVar6;
  long *plVar7;
  undefined8 *puVar8;
  int iVar9;
  AVSValue arg;
  AVSValue AStack_38;
  
  iVar3 = NameToIndex(this,name);
  if (AVS_linkage != (AVS_Linkage *)0x0) {
    pAVar4 = &this->_args;
    uVar1 = AVS_linkage->Size;
    if (0x508 < uVar1) {
      pcVar5 = (code *)AVS_linkage->AVSValue_OPERATOR_INDEX;
      plVar7 = (long *)((long)&pAVar4->type + *(long *)&AVS_linkage->field_0x510);
      if (((ulong)pcVar5 & 1) != 0) {
        pcVar5 = *(code **)(pcVar5 + *plVar7 + -1);
      }
      pAVar4 = (AVSValue *)(*pcVar5)(plVar7,iVar3);
      if (AVS_linkage == (AVS_Linkage *)0x0) goto LAB_0010fa96;
      uVar1 = AVS_linkage->Size;
    }
    if (0x4d8 < uVar1) {
      pcVar5 = (code *)AVS_linkage->AVSValue_CONSTRUCTOR9;
      plVar7 = (long *)((long)&AStack_38.type + *(long *)&AVS_linkage->field_0x4e0);
      if (((ulong)pcVar5 & 1) != 0) {
        pcVar5 = *(code **)(pcVar5 + *plVar7 + -1);
      }
      (*pcVar5)(plVar7,pAVar4);
      if (AVS_linkage == (AVS_Linkage *)0x0) goto LAB_0010fa96;
    }
    if (0x578 < (uint)AVS_linkage->Size) {
      pcVar5 = (code *)AVS_linkage->IsArray;
      if (((ulong)pcVar5 & 1) != 0) {
        pcVar5 = *(code **)(pcVar5 + *(long *)((long)&AStack_38.type +
                                              *(long *)&AVS_linkage->field_0x580) + -1);
      }
      cVar2 = (*pcVar5)();
      if (cVar2 != '\0') {
        if ((AVS_linkage == (AVS_Linkage *)0x0) || ((uint)AVS_linkage->Size < 0x629)) {
          *(undefined8 *)(output + 0x10) = *(undefined8 *)output;
          *(undefined4 *)(output + 0x18) = 0;
        }
        else {
          pcVar5 = (code *)AVS_linkage->ArraySize;
          if (((ulong)pcVar5 & 1) != 0) {
            pcVar5 = *(code **)(pcVar5 + *(long *)((long)&AStack_38.type +
                                                  *(long *)&AVS_linkage->field_0x630) + -1);
          }
          iVar3 = (*pcVar5)();
          *(undefined8 *)(output + 0x10) = *(undefined8 *)output;
          *(undefined4 *)(output + 0x18) = 0;
          if (0 < iVar3) {
            iVar9 = 0;
            do {
              if ((AVS_linkage == (AVS_Linkage *)0x0) || ((uint)AVS_linkage->Size < 0x509)) {
LAB_0010fa5a:
                __x = false;
              }
              else {
                pcVar5 = (code *)AVS_linkage->AVSValue_OPERATOR_INDEX;
                plVar7 = (long *)((long)&AStack_38.type + *(long *)&AVS_linkage->field_0x510);
                if (((ulong)pcVar5 & 1) != 0) {
                  pcVar5 = *(code **)(pcVar5 + *plVar7 + -1);
                }
                lVar6 = (*pcVar5)(plVar7,iVar9);
                if ((AVS_linkage == (AVS_Linkage *)0x0) || ((uint)AVS_linkage->Size < 0x599))
                goto LAB_0010fa5a;
                pcVar5 = (code *)AVS_linkage->AsBool1;
                plVar7 = (long *)(lVar6 + *(long *)&AVS_linkage->field_0x5a0);
                if (((ulong)pcVar5 & 1) != 0) {
                  pcVar5 = *(code **)(pcVar5 + *plVar7 + -1);
                }
                __x = (*pcVar5)(plVar7);
              }
              std::vector<bool,_std::allocator<bool>_>::push_back(output,(bool)__x);
              iVar9 = iVar9 + 1;
            } while (iVar3 != iVar9);
          }
        }
        AVSValue::~AVSValue(&AStack_38);
        return;
      }
    }
  }
LAB_0010fa96:
  puVar8 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar8 = "Argument is not array";
  __cxa_throw(puVar8,&char_const*::typeinfo,0);
}

Assistant:

void Read(const char* name, std::vector<bool>& output) override {
      auto arg = _args[NameToIndex(name)];
      if (!arg.IsArray())
        throw "Argument is not array";
      auto size = arg.ArraySize();
      output.clear();
      for (int i = 0; i < size; i++)
        output.push_back(arg[i].AsBool());
    }